

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O1

void __thiscall
swrenderer::PalColumnHorizCommand::PalColumnHorizCommand(PalColumnHorizCommand *this)

{
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006ef860;
  (this->super_DrawerCommand)._dest_y =
       (int)((drawerargs::dc_dest - drawerargs::dc_destorg) / (long)drawerargs::dc_pitch);
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006efde8;
  this->_source = drawerargs::dc_source;
  this->_iscale = drawerargs::dc_iscale;
  this->_texturefrac = drawerargs::dc_texturefrac;
  this->_count = drawerargs::dc_count;
  this->_color = drawerargs::dc_color;
  this->_x = drawerargs::dc_x;
  this->_yl = drawerargs::dc_yl;
  return;
}

Assistant:

DrawerCommand()
	{
		_dest_y = static_cast<int>((swrenderer::drawerargs::dc_dest - swrenderer::drawerargs::dc_destorg) / (swrenderer::drawerargs::dc_pitch));
	}